

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O2

void DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong rest;
  byte bVar4;
  char cVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint64_t wp_w;
  ulong uVar9;
  uint64_t ten_kappa;
  DiyFp DVar10;
  ulong uStack_60;
  
  bVar4 = -(char)Mp->e;
  ten_kappa = 1L << (bVar4 & 0x3f);
  DVar10 = DiyFp::operator-(Mp,W);
  wp_w = DVar10.f;
  uVar9 = ten_kappa - 1 & Mp->f;
  uVar6 = Mp->f >> (bVar4 & 0x3f);
  uVar1 = CountDecimalDigit32((uint32_t)uVar6);
  uVar8 = (ulong)uVar1;
  *len = 0;
  do {
    iVar2 = (int)uVar6;
    if ((int)uVar8 < 1) {
      uVar1 = -((int)uVar1 >> 0x1f & uVar1);
      rest = uVar9;
      do {
        cVar5 = (char)(rest * 10 >> (bVar4 & 0x3f));
        iVar2 = *len;
        if (cVar5 != '\0' || iVar2 != 0) {
          *len = iVar2 + 1;
          buffer[iVar2] = cVar5 + '0';
        }
        delta = delta * 10;
        rest = rest * 10 & ten_kappa - 1;
        uVar1 = uVar1 + 1;
      } while (delta <= rest);
      *K = *K - uVar1;
      iVar2 = *len;
      wp_w = wp_w * DigitGen::kPow10[uVar1];
      goto LAB_00153bc4;
    }
    uVar7 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar7;
    switch(uVar8) {
    case 0:
      uStack_60 = 0;
      goto LAB_00153ade;
    case 1:
      uStack_60 = 10;
      break;
    case 2:
      uStack_60 = 100;
      break;
    case 3:
      uStack_60 = 1000;
      break;
    case 4:
      uStack_60 = 10000;
      break;
    case 5:
      uStack_60 = 100000;
      break;
    case 6:
      uStack_60 = 1000000;
      break;
    case 7:
      iVar2 = (int)((uVar6 & 0xffffffff) / 10000000);
      uStack_60 = (uVar6 & 0xffffffff) % 10000000;
      goto LAB_00153ade;
    case 8:
      iVar2 = (int)((uVar6 & 0xffffffff) / 100000000);
      uStack_60 = (uVar6 & 0xffffffff) % 100000000;
      goto LAB_00153ade;
    case 9:
      iVar2 = (int)((uVar6 & 0xffffffff) / 1000000000);
      uStack_60 = (uVar6 & 0xffffffff) % 1000000000;
      goto LAB_00153ade;
    default:
      iVar3 = *len;
      uStack_60 = uVar6 & 0xffffffff;
      goto LAB_00153af6;
    }
    iVar2 = (int)((uVar6 & 0xffffffff) / uStack_60);
    uStack_60 = (uVar6 & 0xffffffff) % uStack_60;
LAB_00153ade:
    iVar3 = *len;
    uVar6 = uStack_60;
    if (iVar2 == 0) {
LAB_00153af6:
      cVar5 = '0';
      if (iVar3 != 0) goto LAB_00153afc;
    }
    else {
      cVar5 = (char)iVar2 + '0';
LAB_00153afc:
      *len = iVar3 + 1;
      buffer[iVar3] = cVar5;
      uVar6 = uStack_60;
    }
    rest = ((uVar6 & 0xffffffff) << (bVar4 & 0x3f)) + uVar9;
    if (rest <= delta) {
      *K = *K + uVar7;
      ten_kappa = (ulong)DigitGen::kPow10[uVar8] << (bVar4 & 0x3f);
      iVar2 = *len;
LAB_00153bc4:
      GrisuRound(buffer,iVar2,delta,rest,ten_kappa,wp_w);
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
	static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
	const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
	const DiyFp wp_w = Mp - W;
	uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
	uint64_t p2 = Mp.f & (one.f - 1);
	int kappa = static_cast<int>(CountDecimalDigit32(p1));
	*len = 0;

	while (kappa > 0) {
		uint32_t d;
		switch (kappa) {
			case 10: d = p1 / 1000000000; p1 %= 1000000000; break;
			case  9: d = p1 /  100000000; p1 %=  100000000; break;
			case  8: d = p1 /   10000000; p1 %=   10000000; break;
			case  7: d = p1 /    1000000; p1 %=    1000000; break;
			case  6: d = p1 /     100000; p1 %=     100000; break;
			case  5: d = p1 /      10000; p1 %=      10000; break;
			case  4: d = p1 /       1000; p1 %=       1000; break;
			case  3: d = p1 /        100; p1 %=        100; break;
			case  2: d = p1 /         10; p1 %=         10; break;
			case  1: d = p1;              p1 =           0; break;
			default:
#if defined(_MSC_VER)
				__assume(0);
#elif defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 5))
				__builtin_unreachable();
#else
				d = 0;
#endif
		}
		if (d || *len)
			buffer[(*len)++] = '0' + static_cast<char>(d);
		kappa--;
		uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
		if (tmp <= delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
			return;
		}
	}

	// kappa = 0
	for (;;) {
		p2 *= 10;
		delta *= 10;
		char d = static_cast<char>(p2 >> -one.e);
		if (d || *len)
			buffer[(*len)++] = '0' + d;
		p2 &= one.f - 1;
		kappa--;
		if (p2 < delta) {
			*K += kappa;
			GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * kPow10[-kappa]);
			return;
		}
	}
}